

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O2

int64_t getPSDuration(char *fileName)

{
  byte bVar1;
  bool bVar2;
  uint8_t *buffer;
  ulong uVar3;
  PESPacket *this;
  int64_t iVar4;
  int64_t iVar5;
  size_t __nbytes;
  long lVar6;
  int bufferSize;
  int64_t fileSize;
  File file;
  
  __nbytes = 0;
  File::File(&file,fileName,1,0);
  bVar2 = File::size(&file,&fileSize);
  if (bVar2) {
    buffer = (uint8_t *)operator_new__(0x40000);
    uVar3 = File::read(&file,(int)buffer,(void *)0x40000,__nbytes);
    if (0 < (int)uVar3) {
      this = (PESPacket *)MPEGHeader::findNextMarker(buffer,buffer + (uVar3 & 0xffffffff));
      iVar4 = 0;
      for (; this <= (PESPacket *)(buffer + ((uVar3 & 0xffffffff) - 9));
          this = (PESPacket *)
                 MPEGHeader::findNextMarker(&this->m_pesPacketLenHi,buffer + (uVar3 & 0xffffffff)))
      {
        if (((byte)(this->m_streamID + 0x41) < 0x31 || (this->m_streamID & 0xbf) == 0xbd) &&
           ((char)this->flagsLo < '\0')) {
          iVar4 = PESPacket::getPts(this);
          break;
        }
      }
      operator_delete__(buffer);
      bufferSize = 0x40000;
      bVar1 = 1;
      do {
        iVar5 = getLastPCR(&file,bufferSize,fileSize);
        bufferSize = 0x100000;
        bVar2 = (bool)(bVar1 & iVar5 == -1);
        bVar1 = 0;
      } while (bVar2);
      File::close(&file,0x100000);
      lVar6 = 0;
      if (-1 < iVar5) {
        lVar6 = iVar5 - iVar4;
      }
      goto LAB_001cf9a9;
    }
    operator_delete__(buffer);
  }
  lVar6 = 0;
LAB_001cf9a9:
  File::~File(&file);
  return lVar6;
}

Assistant:

int64_t getPSDuration(const char* fileName)
{
    constexpr int BUF_SIZE = 1024 * 256;

    try
    {
        int64_t fileSize;
        File file(fileName, File::ofRead);
        if (!file.size(&fileSize))
            return 0;

        const auto tmpBuffer = new uint8_t[BUF_SIZE];

        // pcr from start of file
        const int len = file.read(tmpBuffer, BUF_SIZE);
        if (len < 1)
        {
            delete[] tmpBuffer;
            return 0;
        }
        uint8_t* curPtr = tmpBuffer;
        int64_t firstPcrVal = 0;
        uint8_t* bufEnd = tmpBuffer + len;
        curPtr = MPEGHeader::findNextMarker(curPtr, bufEnd);
        while (curPtr <= bufEnd - 9)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(curPtr);
            const uint8_t startcode = curPtr[3];
            if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) ||
                (startcode == PES_VC1_ID) || (startcode == PES_PRIVATE_DATA2))
            {
                if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    firstPcrVal = pesPacket->getPts();
                    break;
                }
            }
            curPtr = MPEGHeader::findNextMarker(curPtr + 4, bufEnd);
        }
        delete[] tmpBuffer;

        // pcr from end of file

        int64_t lastPcrVal;
        int bufferSize = BUF_SIZE;
        do
        {
            lastPcrVal = getLastPCR(file, bufferSize, fileSize);
            bufferSize *= 4;
        } while (lastPcrVal == -1 && bufferSize <= 1024 * 1024);

        file.close();

        return lastPcrVal >= 0 ? lastPcrVal - firstPcrVal : 0;
    }
    catch (...)
    {
        return 0;
    }
}